

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_result_zeroblob64(sqlite3_context *pCtx,u64 n)

{
  Mem *pOut;
  u64 n_local;
  sqlite3_context *pCtx_local;
  
  if ((ulong)(long)pCtx->pOut->db->aLimit[0] < n) {
    pCtx_local._4_4_ = 0x12;
  }
  else {
    sqlite3VdbeMemSetZeroBlob(pCtx->pOut,(int)n);
    pCtx_local._4_4_ = 0;
  }
  return pCtx_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_result_zeroblob64(sqlite3_context *pCtx, u64 n){
  Mem *pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pOut->db->mutex) );
  if( n>(u64)pOut->db->aLimit[SQLITE_LIMIT_LENGTH] ){
    return SQLITE_TOOBIG;
  }
  sqlite3VdbeMemSetZeroBlob(pCtx->pOut, (int)n);
  return SQLITE_OK;
}